

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O3

bool __thiscall HighsCutGeneration::determineCover(HighsCutGeneration *this,bool lpSol)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  pointer piVar2;
  iterator __position;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  anon_class_24_3_1824b316 comp;
  int iVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  HighsInt *pHVar15;
  int __tmp;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  anon_class_16_2_fd512ddf comp_00;
  HighsInt r;
  undefined1 in_stack_ffffffffffffff98;
  uint local_44;
  int local_40;
  uint uStack_3c;
  long lStack_38;
  HighsInt *local_30;
  
  if ((this->rhs).hi + (this->rhs).lo <= this->feastol * 10.0) {
    return false;
  }
  this_00 = &this->cover;
  piVar2 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  std::vector<int,_std::allocator<int>_>::reserve(this_00,(long)this->rowlen);
  _local_40 = (HighsCutGeneration *)((ulong)uStack_3c << 0x20);
  if (this->rowlen != 0) {
    iVar6 = 0;
    do {
      if (((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar6] != '\0') &&
         ((!lpSol ||
          (this->feastol <
           (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar6])))) {
        __position._M_current =
             (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)this_00,__position,&stack0xffffffffffffffc0)
          ;
        }
        else {
          *__position._M_current = iVar6;
          (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      iVar6 = local_40 + 1;
      _local_40 = (HighsCutGeneration *)CONCAT44(uStack_3c,iVar6);
    } while (iVar6 != this->rowlen);
  }
  begin._M_current =
       (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  piVar7 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar12 = (long)piVar7 - (long)begin._M_current;
  uVar18 = (uint)(uVar12 >> 2);
  uVar11 = (this->randgen).state;
  uVar11 = uVar11 >> 0xc ^ uVar11;
  uVar11 = uVar11 << 0x19 ^ uVar11;
  uVar11 = uVar11 >> 0x1b ^ uVar11;
  (this->randgen).state = uVar11;
  local_44 = (uint)(((uVar11 >> 0x20) + 0x80c8963be3e4c2f3) *
                    ((uVar11 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x21);
  (this->coverweight).hi = 0.0;
  (this->coverweight).lo = 0.0;
  if (lpSol) {
    piVar8 = piVar7;
    if (begin._M_current != piVar7) {
      pdVar3 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar22 = this->feastol;
      _Var14._M_current = begin._M_current;
      do {
        while (piVar8 = _Var14._M_current, iVar6 = *piVar8, pdVar3[iVar6] - dVar22 <= pdVar4[iVar6])
        {
          _Var14._M_current = piVar8 + 1;
          piVar8 = piVar7;
          if (_Var14._M_current == piVar7) goto LAB_0027b53f;
        }
        do {
          piVar7 = piVar7 + -1;
          if (piVar7 == piVar8) goto LAB_0027b53f;
          iVar1 = *piVar7;
        } while (pdVar4[iVar1] < pdVar3[iVar1] - dVar22);
        *piVar8 = iVar1;
        *piVar7 = iVar6;
        _Var14._M_current = piVar8 + 1;
      } while (piVar7 != piVar8 + 1);
      piVar8 = piVar8 + 1;
    }
LAB_0027b53f:
    uVar11 = (ulong)((long)piVar8 - (long)begin._M_current) >> 2;
    if ((int)uVar11 != 0) {
      pdVar3 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = this->vals;
      uVar16 = 0;
      dVar20 = 0.0;
      dVar22 = 0.0;
      do {
        dVar23 = pdVar5[begin._M_current[uVar16]] * pdVar3[begin._M_current[uVar16]];
        dVar21 = dVar22 + dVar23;
        (this->coverweight).hi = dVar21;
        dVar20 = dVar20 + (dVar22 - (dVar21 - dVar23)) + (dVar23 - (dVar21 - (dVar21 - dVar23)));
        (this->coverweight).lo = dVar20;
        uVar16 = uVar16 + 1;
        dVar22 = dVar21;
      } while ((uVar11 & 0xffffffff) != uVar16);
    }
    lVar9 = ((long)piVar8 - (long)begin._M_current) * 0x40000000 >> 0x1e;
    lVar13 = (long)(uVar12 * 0x40000000) >> 0x1e;
    lVar10 = lVar13 - lVar9;
    if (lVar10 != 0) {
      uVar12 = lVar10 >> 2;
      pHVar15 = (HighsInt *)0x0;
      if (1 < uVar12) {
        pHVar15 = (HighsInt *)0x0;
        do {
          uVar12 = (long)uVar12 >> 1;
          pHVar15 = (HighsInt *)(ulong)((int)pHVar15 + 1);
        } while (1 < uVar12);
      }
      comp_00.r = pHVar15;
      comp_00.this = (HighsCutGeneration *)&stack0xffffffffffffffbc;
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1,false>
                ((pdqsort_detail *)(lVar9 + (long)begin._M_current),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (lVar13 + begin._M_current),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,comp_00,1,
                 (bool)in_stack_ffffffffffffff98);
    }
  }
  else {
    lStack_38 = (long)(this->lpRelaxation->mipsolver->mipdata_)._M_t.
                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                      .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x67f0;
    lVar9 = uVar12 * 0x40000000;
    local_30 = (HighsInt *)&stack0xffffffffffffffbc;
    _local_40 = this;
    if (lVar9 != 0) {
      uVar11 = lVar9 >> 0x20;
      iVar6 = 0;
      if (1 < uVar11) {
        iVar6 = 0;
        do {
          uVar11 = (long)uVar11 >> 1;
          iVar6 = iVar6 + 1;
        } while (1 < uVar11);
      }
      comp.nodequeue = (HighsNodeQueue *)lStack_38;
      comp.this = this;
      comp.r = local_30;
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2,false>
                (begin,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       ((lVar9 >> 0x1e) + begin._M_current),comp,iVar6,true);
    }
    uVar11 = 0;
  }
  dVar22 = (this->rhs).hi;
  dVar20 = (this->rhs).lo;
  dVar23 = this->feastol * 10.0;
  dVar21 = ABS(dVar22 + dVar20) * this->feastol;
  if (dVar21 <= dVar23) {
    dVar21 = dVar23;
  }
  uVar19 = uVar18;
  if ((uint)uVar11 != uVar18) {
    dVar23 = (this->coverweight).lo;
    pdVar5 = this->vals;
    pdVar3 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + (int)(uint)uVar11;
    dVar24 = (this->coverweight).hi;
    do {
      dVar25 = dVar24 - dVar22;
      uVar19 = (uint)uVar11;
      if (dVar21 < (((-dVar22 - (dVar25 - dVar24)) + (dVar24 - (dVar25 - (dVar25 - dVar24))) +
                    dVar23) - dVar20) + dVar25) break;
      dVar25 = pdVar5[*piVar7] * pdVar3[*piVar7];
      dVar26 = dVar24 + dVar25;
      (this->coverweight).hi = dVar26;
      dVar23 = dVar23 + (dVar24 - (dVar26 - dVar25)) + (dVar25 - (dVar26 - (dVar26 - dVar25)));
      (this->coverweight).lo = dVar23;
      uVar17 = (uint)uVar11 + 1;
      uVar11 = (ulong)uVar17;
      piVar7 = piVar7 + 1;
      dVar24 = dVar26;
      uVar19 = uVar18;
    } while (uVar18 != uVar17);
  }
  if (uVar19 != 0) {
    dVar23 = (this->coverweight).hi;
    dVar24 = (this->coverweight).lo;
    dVar25 = dVar23 + dVar24;
    dVar26 = dVar25 - dVar22;
    (this->coverweight).hi = dVar25;
    dVar23 = (dVar24 - (dVar25 - dVar23)) + (dVar23 - (dVar25 - (dVar25 - dVar23)));
    (this->coverweight).lo = dVar23;
    dVar20 = ((-dVar22 - (dVar26 - dVar25)) + (dVar25 - (dVar26 - (dVar26 - dVar25))) + dVar23) -
             dVar20;
    (this->lambda).hi = dVar26;
    (this->lambda).lo = dVar20;
    if (dVar21 < dVar20 + dVar26) {
      std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(int)uVar19);
      return true;
    }
  }
  return false;
}

Assistant:

bool HighsCutGeneration::determineCover(bool lpSol) {
  if (rhs <= 10 * feastol) return false;

  cover.clear();
  cover.reserve(rowlen);

  for (HighsInt j = 0; j != rowlen; ++j) {
    if (!isintegral[j]) continue;

    if (lpSol && solval[j] <= feastol) continue;

    cover.push_back(j);
  }

  HighsInt maxCoverSize = cover.size();
  HighsInt coversize = 0;
  HighsInt r = randgen.integer();
  coverweight = 0.0;
  if (lpSol) {
    // take all variables that sit at their upper bound always into the cover
    coversize = std::partition(cover.begin(), cover.end(),
                               [&](HighsInt j) {
                                 return solval[j] >= upper[j] - feastol;
                               }) -
                cover.begin();

    for (HighsInt i = 0; i != coversize; ++i) {
      HighsInt j = cover[i];

      assert(solval[j] >= upper[j] - feastol);

      coverweight += vals[j] * upper[j];
    }

    // sort the remaining variables by the contribution to the rows activity in
    // the current solution
    pdqsort(cover.begin() + coversize, cover.begin() + maxCoverSize,
            [&](HighsInt i, HighsInt j) {
              if (upper[i] < 1.5 && upper[j] > 1.5) return true;
              if (upper[i] > 1.5 && upper[j] < 1.5) return false;

              double contributionA = solval[i] * vals[i];
              double contributionB = solval[j] * vals[j];

              if (contributionA > contributionB + feastol) return true;
              if (contributionA < contributionB - feastol) return false;
              // for equal contributions take the larger coefficients first
              // because this makes some of the lifting functions more likely
              // to generate a facet
              // if the value is equal too, choose a random tiebreaker based
              // on hashing the column index and the current number of pool
              // cuts
              if (std::abs(vals[i] - vals[j]) <= feastol)
                return HighsHashHelpers::hash(std::make_pair(inds[i], r)) >
                       HighsHashHelpers::hash(std::make_pair(inds[j], r));
              return vals[i] > vals[j];
            });
  } else {
    // the current solution
    const auto& nodequeue = lpRelaxation.getMipSolver().mipdata_->nodequeue;

    pdqsort(cover.begin() + coversize, cover.begin() + maxCoverSize,
            [&](HighsInt i, HighsInt j) {
              if (solval[i] > feastol && solval[j] <= feastol) return true;
              if (solval[i] <= feastol && solval[j] > feastol) return false;

              int64_t numNodesA;
              int64_t numNodesB;

              numNodesA = complementation[i] ? nodequeue.numNodesDown(inds[i])
                                             : nodequeue.numNodesUp(inds[i]);

              numNodesB = complementation[j] ? nodequeue.numNodesDown(inds[j])
                                             : nodequeue.numNodesUp(inds[j]);

              if (numNodesA > numNodesB) return true;
              if (numNodesA < numNodesB) return false;

              return HighsHashHelpers::hash(std::make_pair(inds[i], r)) >
                     HighsHashHelpers::hash(std::make_pair(inds[j], r));
            });
  }

  const double minlambda =
      std::max(10 * feastol, feastol * std::abs(double(rhs)));

  for (; coversize != maxCoverSize; ++coversize) {
    double lambda = double(coverweight - rhs);
    if (lambda > minlambda) break;

    HighsInt j = cover[coversize];
    coverweight += vals[j] * upper[j];
  }
  if (coversize == 0) return false;

  coverweight.renormalize();
  lambda = coverweight - rhs;

  if (lambda <= minlambda) return false;

  cover.resize(coversize);
  assert(lambda > feastol);

  return true;
}